

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                    (string *str,uint8_t *target)

{
  bool bVar1;
  uint uVar2;
  string *__s;
  size_t sVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint8_t local_20 [16];
  
  if (str->_M_string_length >> 0x20 == 0) {
    __s = (string *)0x0;
  }
  else {
    __s = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,long>
                    (str->_M_string_length,0xffffffff,
                     "str.size() <= std::numeric_limits<uint32_t>::max()");
  }
  if (__s != (string *)0x0) {
    puVar5 = local_20;
    WriteStringWithSizeToArray();
    sVar3 = strlen((char *)__s);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (puVar5,sVar3,__s);
    return puVar5;
  }
  uVar2 = (uint)str->_M_string_length;
  uVar4 = uVar2;
  if (0x7f < uVar2) {
    do {
      *target = (byte)uVar4 | 0x80;
      uVar2 = uVar4 >> 7;
      target = target + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar2;
    } while (bVar1);
  }
  *target = (byte)uVar2;
  uVar2 = (uint)str->_M_string_length;
  memcpy(target + 1,(str->_M_dataplus)._M_p,(ulong)uVar2);
  return target + (long)(int)uVar2 + 1;
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8_t* target) {
  ABSL_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}